

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-concurrency.c
# Opt level: O0

void test_stream_concurrency(void)

{
  byte bVar1;
  uint uVar2;
  unsigned_long uVar3;
  quicly_conn_t *pqVar4;
  ptls_iovec_t pVar5;
  int iVar6;
  size_t sVar7;
  quicly_cid_plaintext_t *pqVar8;
  long lVar9;
  bool bVar10;
  size_t asStack_1a0 [3];
  uint64_t auStack_188 [2];
  long local_178;
  unsigned_long local_170;
  quicly_cid_plaintext_t *local_168;
  size_t local_160;
  uint64_t local_158;
  ptls_iovec_t local_150;
  quicly_decoded_packet_t decoded;
  size_t num_packets;
  unsigned_long __vla_expr2;
  iovec raw;
  undefined1 auStack_88 [4];
  quicly_address_t src;
  quicly_address_t dest;
  int ret;
  size_t i;
  test_streambuf_t *server_streambuf;
  unsigned_long __vla_expr1;
  quicly_stream_t *server_stream;
  unsigned_long __vla_expr0;
  uint64_t local_20;
  size_t limit;
  quicly_conn_t *server;
  quicly_conn_t *client;
  
  __vla_expr0 = (unsigned_long)&local_178;
  local_20 = quic_ctx.transport_params.max_streams_bidi;
  server_stream = (quicly_stream_t *)(quic_ctx.transport_params.max_streams_bidi + 2);
  local_178 = (long)&local_178 -
              (quic_ctx.transport_params.max_streams_bidi * 8 + 0x1f & 0xfffffffffffffff0);
  server_streambuf = (test_streambuf_t *)(quic_ctx.transport_params.max_streams_bidi + 1);
  local_170 = local_178 -
              (quic_ctx.transport_params.max_streams_bidi * 8 + 0x17 & 0xfffffffffffffff0);
  local_158 = quic_ctx.transport_params.max_udp_payload_size;
  lVar9 = local_170 - (quic_ctx.transport_params.max_udp_payload_size + 0xf & 0xfffffffffffffff0);
  num_packets = quic_ctx.transport_params.max_udp_payload_size;
  local_160 = lVar9;
  __vla_expr2 = local_170;
  *(undefined8 *)(lVar9 + -8) = 0x13a972;
  local_168 = new_master_id();
  *(undefined8 *)(lVar9 + -8) = 0x13a985;
  local_150 = ptls_iovec_init((void *)0x0,0);
  pVar5 = local_150;
  *(uint8_t **)(lVar9 + -0x20) = local_150.base;
  local_150 = pVar5;
  *(size_t *)(lVar9 + -0x18) = local_150.len;
  *(undefined8 *)(lVar9 + -0x10) = 0;
  *(undefined8 *)(lVar9 + -8) = 0;
  *(undefined8 *)(lVar9 + -0x28) = 0x13a9ea;
  iVar6 = quicly_connect(*(quicly_conn_t ***)(lVar9 + 0x168),*(quicly_context_t **)(lVar9 + 0x160),
                         *(char **)(lVar9 + 0x158),*(sockaddr **)(lVar9 + 0x150),
                         *(sockaddr **)(lVar9 + 0x148),*(quicly_cid_plaintext_t **)(lVar9 + 0x140),
                         *(ptls_iovec_t *)(lVar9 + 0x178),
                         *(ptls_handshake_properties_t **)(lVar9 + 0x188),
                         *(quicly_transport_parameters_t **)(lVar9 + 400));
  dest._20_4_ = iVar6;
  *(undefined8 *)(lVar9 + -8) = 0x13aa17;
  _ok((int)(ulong)(iVar6 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,0x2c);
  decoded._is_stateless_reset_cached = QUICLY__DECODED_PACKET_CACHED_IS_STATELESS_RESET;
  decoded._132_4_ = 0;
  *(uint64_t *)(lVar9 + -0x10) = local_158;
  *(undefined8 *)(lVar9 + -0x18) = 0x13aa5a;
  iVar6 = quicly_send(*(quicly_conn_t **)(lVar9 + 0xb8),*(quicly_address_t **)(lVar9 + 0xb0),
                      *(quicly_address_t **)(lVar9 + 0xa8),*(iovec **)(lVar9 + 0xa0),
                      *(size_t **)(lVar9 + 0x98),*(void **)(lVar9 + 0x90),*(size_t *)(lVar9 + 200));
  dest._20_4_ = iVar6;
  *(undefined8 *)(lVar9 + -8) = 0x13aa87;
  _ok((int)(ulong)(iVar6 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,0x2f);
  bVar10 = decoded._128_8_ == 1;
  *(undefined8 *)(lVar9 + -8) = 0x13aab1;
  _ok((int)(ulong)bVar10,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,0x30);
  *(undefined8 *)(lVar9 + -8) = 0x13aac9;
  sVar7 = decode_packets(*(quicly_decoded_packet_t **)(lVar9 + 0x28),*(iovec **)(lVar9 + 0x20),
                         *(size_t *)(lVar9 + 0x18));
  *(undefined8 *)(lVar9 + -8) = 0x13aaef;
  _ok((int)(ulong)(sVar7 == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,0x31);
  bVar10 = decoded._128_8_ == 1;
  *(undefined8 *)(lVar9 + -8) = 0x13ab19;
  _ok((int)(ulong)bVar10,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,0x32);
  *(undefined8 *)(lVar9 + -8) = 0x13ab1e;
  pqVar8 = new_master_id();
  *(quicly_cid_plaintext_t **)(lVar9 + -0x10) = pqVar8;
  *(undefined8 *)(lVar9 + -8) = 0;
  *(undefined8 *)(lVar9 + -0x18) = 0x13ab55;
  iVar6 = quicly_accept(*(quicly_conn_t ***)(lVar9 + 0x118),*(quicly_context_t **)(lVar9 + 0x110),
                        *(sockaddr **)(lVar9 + 0x108),*(sockaddr **)(lVar9 + 0x100),
                        *(quicly_decoded_packet_t **)(lVar9 + 0xf8),
                        *(quicly_address_token_plaintext_t **)(lVar9 + 0xf0),
                        *(quicly_cid_plaintext_t **)(lVar9 + 0x128),
                        *(ptls_handshake_properties_t **)(lVar9 + 0x130));
  dest._20_4_ = iVar6;
  *(undefined8 *)(lVar9 + -8) = 0x13ab82;
  _ok((int)(ulong)(iVar6 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,0x34);
  pqVar4 = server;
  sVar7 = limit;
  *(undefined8 *)(lVar9 + -8) = 0x13ab8f;
  transmit((quicly_conn_t *)sVar7,pqVar4);
  uVar3 = __vla_expr2;
  stack0xffffffffffffffb0 = 0;
  do {
    if (local_20 + 1 <= stack0xffffffffffffffb0) {
LAB_0013ac99:
      bVar10 = stack0xffffffffffffffb0 == local_20;
      *(undefined8 *)(uVar3 - 8) = 0x13acc3;
      _ok((int)(ulong)bVar10,"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
          ,0x42);
      pqVar4 = server;
      sVar7 = limit;
      *(undefined8 *)(uVar3 - 8) = 0x13acd0;
      transmit(pqVar4,(quicly_conn_t *)sVar7);
      pqVar4 = server;
      sVar7 = limit;
      *(undefined8 *)(uVar3 - 8) = 0x13acdd;
      transmit((quicly_conn_t *)sVar7,pqVar4);
      bVar1 = *(byte *)(*(long *)(local_178 + stack0xffffffffffffffb0 * 8) + 0xb8);
      *(undefined8 *)(uVar3 - 8) = 0x13ad11;
      _ok((int)(ulong)(bVar1 & 1),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
          ,0x48);
      *(undefined8 *)(uVar3 - 8) = 0x13ad31;
      __vla_expr1 = (unsigned_long)
                    quicly_get_stream(*(quicly_conn_t **)(uVar3 + 0x10),
                                      *(quicly_stream_id_t *)(uVar3 + 8));
      bVar10 = (quicly_stream_t *)__vla_expr1 != (quicly_stream_t *)0x0;
      *(undefined8 *)(uVar3 - 8) = 0x13ad5c;
      _ok((int)(ulong)bVar10,"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
          ,0x4c);
      i = *(size_t *)(__vla_expr1 + 0xb0);
      *(undefined8 *)(uVar3 - 8) = 0x13ad88;
      quicly_reset_stream(*(quicly_stream_t **)(uVar3 + 8),*(int *)(uVar3 + 4));
      *(undefined8 *)(uVar3 - 8) = 0x13ada5;
      quicly_request_stop(*(quicly_stream_t **)(uVar3 + 8),*(int *)(uVar3 + 4));
      pqVar4 = server;
      sVar7 = limit;
      *(undefined8 *)(uVar3 - 8) = 0x13adb2;
      transmit(pqVar4,(quicly_conn_t *)sVar7);
      pqVar4 = server;
      sVar7 = limit;
      quic_now = quic_now + 0x19;
      *(undefined8 *)(uVar3 - 8) = 0x13add7;
      transmit((quicly_conn_t *)sVar7,pqVar4);
      iVar6 = *(int *)(i + 0x4c);
      *(undefined8 *)(uVar3 - 8) = 0x13ae04;
      _ok((int)(ulong)(iVar6 == 0x3007b),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
          ,0x53);
      iVar6 = *(int *)(i + 0x48);
      *(undefined8 *)(uVar3 - 8) = 0x13ae31;
      _ok((int)(ulong)(iVar6 == 0x301c8),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
          ,0x54);
      iVar6 = *(int *)(i + 0x50);
      *(undefined8 *)(uVar3 - 8) = 0x13ae5d;
      _ok((int)(ulong)((iVar6 != 0 ^ 0xffU) & 1),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
          ,0x55);
      iVar6 = *(int *)(*(long *)(local_170 + (stack0xffffffffffffffb0 - 1) * 8) + 0x4c);
      *(undefined8 *)(uVar3 - 8) = 0x13ae99;
      _ok((int)(ulong)(iVar6 == 0x301c8),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
          ,0x56);
      uVar2 = *(uint *)(*(long *)(local_170 + (stack0xffffffffffffffb0 - 1) * 8) + 0x50);
      *(undefined8 *)(uVar3 - 8) = 0x13aec9;
      _ok((int)(ulong)uVar2,"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
          ,0x57);
      bVar1 = *(byte *)(*(long *)(local_178 + stack0xffffffffffffffb0 * 8) + 0xb8);
      *(undefined8 *)(uVar3 - 8) = 0x13aefd;
      _ok((int)(ulong)(bVar1 & 1),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
          ,0x5a);
      pqVar4 = server;
      sVar7 = limit;
      quic_now = quic_now + 0x19;
      *(undefined8 *)(uVar3 - 8) = 0x13af22;
      transmit(pqVar4,(quicly_conn_t *)sVar7);
      *(undefined8 *)(uVar3 - 8) = 0x13af2f;
      transmit((quicly_conn_t *)limit,server);
      uVar2 = *(uint *)(i + 0x50);
      *(undefined8 *)(uVar3 - 8) = 0x13af50;
      _ok((int)(ulong)uVar2,"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
          ,0x61);
      bVar1 = *(byte *)(*(long *)(local_178 + stack0xffffffffffffffb0 * 8) + 0xb8);
      *(undefined8 *)(uVar3 - 8) = 0x13af91;
      _ok((int)(ulong)(((bVar1 & 1) != 0 ^ 0xffU) & 1),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
          ,0x62);
      register0x00000000 = stack0xffffffffffffffb0 + 1;
      *(undefined8 *)(uVar3 - 8) = 0x13afba;
      dest._20_4_ = quicly_open_stream(*(quicly_conn_t **)(uVar3 + 0x40),
                                       *(quicly_stream_t ***)(uVar3 + 0x38),*(int *)(uVar3 + 0x34));
      bVar10 = dest._20_4_ == 0;
      *(undefined8 *)(uVar3 - 8) = 0x13afe3;
      _ok((int)(ulong)bVar10,"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
          ,0x67);
      bVar1 = *(byte *)(*(long *)(local_178 + stack0xffffffffffffffb0 * 8) + 0xb8);
      *(undefined8 *)(uVar3 - 8) = 0x13b017;
      _ok((int)(ulong)(bVar1 & 1),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
          ,0x68);
      *(undefined8 *)(uVar3 - 8) = 0x13b020;
      quicly_free(*(quicly_conn_t **)(uVar3 + 8));
      *(undefined8 *)(uVar3 - 8) = 0x13b029;
      quicly_free(*(quicly_conn_t **)(uVar3 + 8));
      return;
    }
    *(undefined8 *)(uVar3 - 8) = 0x13abd3;
    iVar6 = quicly_open_stream(*(quicly_conn_t **)(uVar3 + 0x40),
                               *(quicly_stream_t ***)(uVar3 + 0x38),*(int *)(uVar3 + 0x34));
    dest._20_4_ = iVar6;
    if (iVar6 != 0) {
      *(undefined8 *)(uVar3 - 8) = 0x13abfd;
      __assert_fail("ret == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
                    ,0x3b,"void test_stream_concurrency(void)");
    }
    *(undefined8 *)(local_170 + stack0xffffffffffffffb0 * 8) =
         *(undefined8 *)(*(long *)(local_178 + stack0xffffffffffffffb0 * 8) + 0xb0);
    if ((*(byte *)(*(long *)(local_178 + stack0xffffffffffffffb0 * 8) + 0xb8) & 1) != 0) {
      dest._20_4_ = 0;
      goto LAB_0013ac99;
    }
    *(undefined8 *)(uVar3 - 8) = 0x13ac5c;
    dest._20_4_ = quicly_streambuf_egress_write
                            (*(quicly_stream_t **)(uVar3 + 0x18),*(void **)(uVar3 + 0x10),
                             *(size_t *)(uVar3 + 8));
    if (dest._20_4_ != 0) {
      *(undefined8 *)(uVar3 - 8) = 0x13ac86;
      __assert_fail("ret == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
                    ,0x40,"void test_stream_concurrency(void)");
    }
    register0x00000000 = stack0xffffffffffffffb0 + 1;
    dest._20_4_ = 0;
  } while( true );
}

Assistant:

void test_stream_concurrency(void)
{
    quicly_conn_t *client, *server;
    size_t limit = quic_ctx.transport_params.max_streams_bidi;
    quicly_stream_t *client_streams[limit + 2], *server_stream;
    test_streambuf_t *client_streambufs[limit + 1], *server_streambuf;
    size_t i;
    int ret;

    { /* connect */
        quicly_address_t dest, src;
        struct iovec raw;
        uint8_t rawbuf[quic_ctx.transport_params.max_udp_payload_size];
        size_t num_packets;
        quicly_decoded_packet_t decoded;

        ret = quicly_connect(&client, &quic_ctx, "example.com", &fake_address.sa, NULL, new_master_id(), ptls_iovec_init(NULL, 0),
                             NULL, NULL);
        ok(ret == 0);
        num_packets = 1;
        ret = quicly_send(client, &dest, &src, &raw, &num_packets, rawbuf, sizeof(rawbuf));
        ok(ret == 0);
        ok(num_packets == 1);
        ok(decode_packets(&decoded, &raw, 1) == 1);
        ok(num_packets == 1);
        ret = quicly_accept(&server, &quic_ctx, NULL, &fake_address.sa, &decoded, NULL, new_master_id(), NULL);
        ok(ret == 0);
        transmit(server, client);
    }

    /* open as many streams as we can */
    for (i = 0; i < limit + 1; ++i) {
        ret = quicly_open_stream(client, client_streams + i, 0);
        assert(ret == 0);
        client_streambufs[i] = client_streams[i]->data;
        if (client_streams[i]->streams_blocked)
            break;
        ret = quicly_streambuf_egress_write(client_streams[i], "hello", 5);
        assert(ret == 0);
    }
    ok(i == limit);

    transmit(client, server);
    transmit(server, client);

    /* the last stream is still ID-blocked after 1RT */
    ok(client_streams[i]->streams_blocked);

    /* reset one stream in both directions and close on the client-side */
    server_stream = quicly_get_stream(server, client_streams[i - 1]->stream_id);
    ok(server_stream != NULL);
    server_streambuf = server_stream->data;
    quicly_reset_stream(client_streams[i - 1], QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(123));
    quicly_request_stop(client_streams[i - 1], QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(456));
    transmit(client, server);
    quic_now += QUICLY_DELAYED_ACK_TIMEOUT;
    transmit(server, client);
    ok(server_streambuf->error_received.reset_stream == QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(123));
    ok(server_streambuf->error_received.stop_sending == QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(456));
    ok(!server_streambuf->is_detached); /* haven't gotten ACK for reset */
    ok(client_streambufs[i - 1]->error_received.reset_stream == QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(456));
    ok(client_streambufs[i - 1]->is_detached);

    /* the last stream is still ID-blocked */
    ok(client_streams[i]->streams_blocked);

    quic_now += QUICLY_DELAYED_ACK_TIMEOUT;
    transmit(client, server);
    transmit(server, client);

    /* we would have free room now that RST of the server-sent side is ACKed */
    ok(server_streambuf->is_detached);
    ok(!client_streams[i]->streams_blocked);
    ++i;

    /* but we cannot open one more */
    ret = quicly_open_stream(client, client_streams + i, 0);
    ok(ret == 0);
    ok(client_streams[i]->streams_blocked);

    quicly_free(client);
    quicly_free(server);
}